

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pingpong.c
# Opt level: O1

CURLcode Curl_pp_statemach(Curl_easy *data,pingpong *pp,_Bool block,_Bool disconnecting)

{
  uint uVar1;
  _Bool _Var2;
  int iVar3;
  int iVar4;
  CURLcode CVar5;
  timediff_t tVar6;
  timediff_t timeout_ms;
  curltime now;
  
  uVar1 = data->conn->sock[0];
  tVar6 = Curl_pp_state_timeout(data,pp,disconnecting);
  if (tVar6 < 1) {
    Curl_failf(data,"server response timeout");
    return CURLE_OPERATION_TIMEDOUT;
  }
  timeout_ms = 1000;
  if (tVar6 < 1000) {
    timeout_ms = tVar6;
  }
  if (!block) {
    timeout_ms = 0;
  }
  _Var2 = Curl_conn_data_pending(data,0);
  iVar3 = 1;
  if (((!_Var2) && (pp->overflow == 0)) &&
     ((pp->sendleft != 0 || (_Var2 = Curl_conn_data_pending(data,0), !_Var2)))) {
    iVar3 = Curl_socket_check(-(uint)(pp->sendleft != 0) | uVar1,-1,
                              -(uint)(pp->sendleft == 0) | uVar1,timeout_ms);
  }
  if (block) {
    iVar4 = Curl_pgrsUpdate(data);
    CVar5 = CURLE_ABORTED_BY_CALLBACK;
    if (iVar4 == 0) {
      now = Curl_now();
      CVar5 = Curl_speedcheck(data,now);
    }
    if (CVar5 != CURLE_OK) {
      return CVar5;
    }
  }
  if (iVar3 == 0) {
    CVar5 = CURLE_OPERATION_TIMEDOUT;
    if (!disconnecting) {
      CVar5 = CURLE_OK;
    }
  }
  else {
    if (iVar3 != -1) {
      CVar5 = (*pp->statemachine)(data,data->conn);
      return CVar5;
    }
    Curl_failf(data,"select/poll error");
    CVar5 = CURLE_OUT_OF_MEMORY;
  }
  return CVar5;
}

Assistant:

CURLcode Curl_pp_statemach(struct Curl_easy *data,
                           struct pingpong *pp, bool block,
                           bool disconnecting)
{
  struct connectdata *conn = data->conn;
  curl_socket_t sock = conn->sock[FIRSTSOCKET];
  int rc;
  timediff_t interval_ms;
  timediff_t timeout_ms = Curl_pp_state_timeout(data, pp, disconnecting);
  CURLcode result = CURLE_OK;

  if(timeout_ms <= 0) {
    failf(data, "server response timeout");
    return CURLE_OPERATION_TIMEDOUT; /* already too little time */
  }

  DEBUGF(infof(data, "pp_statematch, timeout=%" FMT_TIMEDIFF_T, timeout_ms));
  if(block) {
    interval_ms = 1000;  /* use 1 second timeout intervals */
    if(timeout_ms < interval_ms)
      interval_ms = timeout_ms;
  }
  else
    interval_ms = 0; /* immediate */

  if(Curl_conn_data_pending(data, FIRSTSOCKET))
    rc = 1;
  else if(pp->overflow)
    /* We are receiving and there is data in the cache so just read it */
    rc = 1;
  else if(!pp->sendleft && Curl_conn_data_pending(data, FIRSTSOCKET))
    /* We are receiving and there is data ready in the SSL library */
    rc = 1;
  else
    rc = Curl_socket_check(pp->sendleft ? CURL_SOCKET_BAD : sock, /* reading */
                           CURL_SOCKET_BAD,
                           pp->sendleft ? sock : CURL_SOCKET_BAD, /* writing */
                           interval_ms);

  if(block) {
    /* if we did not wait, we do not have to spend time on this now */
    if(Curl_pgrsUpdate(data))
      result = CURLE_ABORTED_BY_CALLBACK;
    else
      result = Curl_speedcheck(data, Curl_now());

    if(result)
      return result;
  }

  if(rc == -1) {
    failf(data, "select/poll error");
    result = CURLE_OUT_OF_MEMORY;
  }
  else if(rc)
    result = pp->statemachine(data, data->conn);
  else if(disconnecting)
    return CURLE_OPERATION_TIMEDOUT;

  return result;
}